

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkObjOrder(Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vNameIds)

{
  uint i_00;
  Cba_ObjType_t CVar1;
  int iVar2;
  int Entry;
  Vec_Ptr_t *p_00;
  char *pcVar3;
  char *pcVar4;
  void *__ptr;
  int i;
  int iVar5;
  char Buffer [1000];
  
  if (1 < vObjs->nSize) {
    p_00 = Vec_PtrAlloc(vObjs->nSize);
    for (iVar5 = 0; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
      i_00 = Vec_IntEntry(vObjs,iVar5);
      CVar1 = Cba_ObjType(p,i_00);
      pcVar4 = p->pDesign->pTypeNames[CVar1];
      if (vNameIds == (Vec_Int_t *)0x0) {
        pcVar3 = Cba_ObjNameStr(p,i_00);
      }
      else {
        iVar2 = Vec_IntEntry(vNameIds,iVar5);
        pcVar3 = Cba_NtkStr(p,iVar2);
      }
      sprintf(Buffer,"%s_%s_%d",pcVar4,pcVar3,(ulong)i_00);
      pcVar4 = Abc_UtilStrsav(Buffer);
      Vec_PtrPush(p_00,pcVar4);
    }
    iVar5 = p_00->nSize;
    if (1 < (long)iVar5) {
      qsort(p_00->pArray,(long)iVar5,8,Cba_StrCmp);
    }
    vObjs->nSize = 0;
    iVar2 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar5 != iVar2; iVar2 = iVar2 + 1) {
      pcVar4 = (char *)Vec_PtrEntry(p_00,iVar2);
      pcVar4 = strrchr(pcVar4,0x5f);
      Entry = atoi(pcVar4 + 1);
      Vec_IntPush(vObjs,Entry);
    }
    if (p_00 != (Vec_Ptr_t *)0x0) {
      for (iVar2 = 0; iVar5 != iVar2; iVar2 = iVar2 + 1) {
        __ptr = Vec_PtrEntry(p_00,iVar2);
        if ((void *)0x2 < __ptr) {
          free(__ptr);
        }
      }
      Vec_PtrFree(p_00);
    }
  }
  return;
}

Assistant:

void Cba_NtkObjOrder( Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vNameIds )
{
    char Buffer[1000], * pName;
    Vec_Ptr_t * vNames;
    int i, iObj;
    if ( Vec_IntSize(vObjs) < 2 )
        return;
    vNames = Vec_PtrAlloc( Vec_IntSize(vObjs) );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        char * pTypeName = Cba_NtkTypeName( p, Cba_ObjType(p, iObj) );
        char * pInstName = vNameIds ? Cba_NtkStr(p, Vec_IntEntry(vNameIds, i)) : Cba_ObjNameStr(p, iObj);
        sprintf( Buffer, "%s_%s_%d", pTypeName, pInstName, iObj );
        Vec_PtrPush( vNames, Abc_UtilStrsav(Buffer) );
    }
    // print before
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // do the sorting
    Vec_PtrSort( vNames, (int (*)(void))Cba_StrCmp );
    // print after
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // reload in a new order
    Vec_IntClear( vObjs );
    Vec_PtrForEachEntry( char *, vNames, pName, i )
        Vec_IntPush( vObjs, atoi(strrchr(pName, '_')+1) );
    Vec_PtrFreeFree( vNames );
}